

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::ld_r_r<(SM83::Registers)2,(SM83::Registers)6>(SM83 *this)

{
  u8 uVar1;
  u8 *puVar2;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_char,_char>
  fmt;
  char *in_stack_ffffffffffffff98;
  u8 *dest;
  v11 *local_28;
  char *local_20;
  SM83 *local_18;
  SM83 *this_local;
  
  local_28 = (v11 *)0x15b568;
  local_20 = (char *)0x47;
  local_18 = this;
  dest._7_1_ = Get8bitRegisterName<(SM83::Registers)2>(this);
  dest._6_1_ = Get8bitRegisterName<(SM83::Registers)6>(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = local_20;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,char,char>
            (local_28,fmt,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,(unsigned_short *)((long)&dest + 7),(char *)((long)&dest + 6),
             in_stack_ffffffffffffff98);
  puVar2 = Get8bitRegisterPointer<(SM83::Registers)2>(this);
  uVar1 = Get8bitRegister<(SM83::Registers)6>(this);
  *puVar2 = uVar1;
  return;
}

Assistant:

void SM83::ld_r_r() {
    LTRACE("LD {}, {}", Get8bitRegisterName<DestRegister>(), Get8bitRegisterName<SrcRegister>());

    u8* dest = Get8bitRegisterPointer<DestRegister>();
    *dest = Get8bitRegister<SrcRegister>();
}